

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::Image::convertTo32(Image *this)

{
  uint uVar1;
  uint8 *puVar2;
  long lVar3;
  int iVar4;
  uint8 *__ptr;
  uint8 *puVar5;
  int iVar6;
  code *pcVar7;
  uint8 *puVar8;
  uint8 *local_60;
  int local_50;
  uint8 *local_48;
  
  uVar1 = this->depth << 0x1e | this->depth - 4U >> 2;
  if (uVar1 < 2) {
    unpalettize(this,true);
    return;
  }
  local_48 = this->pixels;
  if (uVar1 == 3) {
    pcVar7 = conv_RGBA8888_from_ARGB1555;
  }
  else {
    if (uVar1 != 5) {
      return;
    }
    pcVar7 = conv_RGBA8888_from_RGB888;
  }
  lVar3 = (long)this->width * 4;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 650"
  ;
  __ptr = (uint8 *)0x30018;
  puVar2 = (uint8 *)(*DAT_00149de8)(this->height * lVar3);
  local_50 = (int)lVar3;
  if (0 < this->height) {
    iVar6 = 0;
    local_60 = puVar2;
    do {
      if (0 < this->width) {
        iVar4 = 0;
        puVar5 = local_48;
        puVar8 = local_60;
        do {
          __ptr = puVar5;
          (*pcVar7)(puVar8);
          puVar5 = puVar5 + this->bpp;
          puVar8 = puVar8 + 4;
          iVar4 = iVar4 + 1;
        } while (iVar4 < this->width);
      }
      local_48 = local_48 + this->stride;
      local_60 = local_60 + local_50;
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->height);
  }
  free(this,__ptr);
  this->depth = 0x20;
  this->bpp = 4;
  this->stride = local_50;
  this->pixels = (uint8 *)0x0;
  this->palette = (uint8 *)0x0;
  this->pixels = puVar2;
  *(byte *)&this->flags = (byte)this->flags | 1;
  return;
}

Assistant:

void
Image::convertTo32(void)
{
	assert(this->pixels);
	uint8 *pixels = this->pixels;
	int32 newstride = this->width*4;
	uint8 *newpixels;

	void (*fun)(uint8 *out, uint8 *in) = nil;
	switch(this->depth){
	case 4:
	case 8:
		assert(this->palette);
		this->unpalettize(true);
		return;
	case 16:
		fun = conv_RGBA8888_from_ARGB1555;
		break;
	case 24:
		fun = conv_RGBA8888_from_RGB888;
		break;
	default:
		return;
	}

	newpixels = rwNewT(uint8, newstride*this->height, MEMDUR_EVENT | ID_IMAGE);
	uint8 *pixels32 = newpixels;
	for(int y = 0; y < this->height; y++){
		uint8 *line = pixels;
		uint8 *newline = newpixels;
		for(int x = 0; x < this->width; x++){
			fun(newline, line);
			line += this->bpp;
			newline += 4;
		}
		pixels += this->stride;
		newpixels += newstride;
	}

	this->free();
	this->depth = 32;
	this->bpp = 4;
	this->stride = newstride;
	this->pixels = nil;
	this->palette = nil;
	this->setPixels(pixels32);
}